

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::message_hash::test_method(message_hash *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  uint256 *puVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  uint256 message_hash2;
  uint256 message_hash1;
  uint256 signature_hash;
  string prefixed_message;
  string unsigned_tx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&unsigned_tx,"...",(allocator<char> *)&prefixed_message);
  message_hash2.super_base_blob<256U>.m_data._M_elems._0_8_ =
       message_hash2.super_base_blob<256U>.m_data._M_elems + 0x10;
  message_hash2.super_base_blob<256U>.m_data._M_elems[0x10] =
       (uchar)MESSAGE_MAGIC_abi_cxx11_._M_string_length;
  message_hash2.super_base_blob<256U>.m_data._M_elems[8] = '\x01';
  message_hash2.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  message_hash2.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  message_hash2.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  message_hash2.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  message_hash2.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  message_hash2.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  message_hash2.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  message_hash2.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&message_hash1
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &message_hash2,&MESSAGE_MAGIC_abi_cxx11_);
  local_f8._0_8_ = &local_e8;
  local_f8._8_8_ = 1;
  local_e8._M_local_buf[1] = 0;
  local_e8._M_local_buf[0] = (byte)unsigned_tx._M_string_length;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &signature_hash,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&message_hash1
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
  std::operator+(&prefixed_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &signature_hash,&unsigned_tx);
  std::__cxx11::string::~string((string *)&signature_hash);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)&message_hash1);
  std::__cxx11::string::~string((string *)&message_hash2);
  Hash<std::__cxx11::string>(&signature_hash,&unsigned_tx);
  Hash<std::__cxx11::string>(&message_hash1,&prefixed_message);
  MessageHash(&message_hash2,&unsigned_tx);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x6a4;
  file.m_begin = (iterator)&local_108;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_120 = "";
  pvVar2 = (iterator)0x2;
  puVar3 = &message_hash1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (local_f8,&local_128,0x6a4,1,2,puVar3,"message_hash1",&message_hash2,"message_hash2");
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)puVar3;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x6a5;
  file_00.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  local_f8._0_8_ = &PTR__lazy_ostream_01139f30;
  local_e8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_e8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ne_impl,uint256,uint256>
            (local_f8,&local_158,0x6a5,1,3,&message_hash1,"message_hash1",&signature_hash,
             "signature_hash");
  std::__cxx11::string::~string((string *)&prefixed_message);
  std::__cxx11::string::~string((string *)&unsigned_tx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(message_hash)
{
    const std::string unsigned_tx = "...";
    const std::string prefixed_message =
        std::string(1, (char)MESSAGE_MAGIC.length()) +
        MESSAGE_MAGIC +
        std::string(1, (char)unsigned_tx.length()) +
        unsigned_tx;

    const uint256 signature_hash = Hash(unsigned_tx);
    const uint256 message_hash1 = Hash(prefixed_message);
    const uint256 message_hash2 = MessageHash(unsigned_tx);

    BOOST_CHECK_EQUAL(message_hash1, message_hash2);
    BOOST_CHECK_NE(message_hash1, signature_hash);
}